

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_9f746::SuperBlockSizeTestLarge::SetUp(SuperBlockSizeTestLarge *this)

{
  long in_RDI;
  aom_rational timebase;
  TestMode in_stack_000000bc;
  EncoderTest *in_stack_000000c0;
  
  libaom_test::EncoderTest::InitializeConfig(in_stack_000000c0,in_stack_000000bc);
  *(undefined8 *)(in_RDI + 0x58) = 0x1e00000001;
  *(undefined4 *)(in_RDI + 0x90) = *(undefined4 *)(in_RDI + 0x400);
  *(undefined4 *)(in_RDI + 0x34) = 1;
  *(undefined4 *)(in_RDI + 0x68) = 0x23;
  *(undefined4 *)(in_RDI + 0xb8) = 1000;
  return;
}

Assistant:

void SetUp() override {
    InitializeConfig(encoding_mode_);
    const aom_rational timebase = { 1, 30 };
    cfg_.g_timebase = timebase;
    cfg_.rc_end_usage = rc_end_usage_;
    cfg_.g_threads = 1;
    cfg_.g_lag_in_frames = 35;
    cfg_.rc_target_bitrate = 1000;
  }